

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHThreads_Test::TestBody(SSLTest_ECHThreads_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ech_config_len;
  size_t ech_config;
  bool bVar1;
  evp_hpke_key_st *peVar2;
  EVP_HPKE_KEM *pEVar3;
  char *pcVar4;
  char *pcVar5;
  SSL_ECH_KEYS *pSVar6;
  pointer psVar7;
  SSL_METHOD *method;
  pointer psVar8;
  SSL_METHOD *meth;
  pointer server_ctx_00;
  pointer client_00;
  char *in_R9;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_568;
  type local_560;
  undefined1 local_550 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_4d0;
  Message local_4c8;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__12;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_478;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__11;
  UniquePtr<SSL_CTX> client_ctx;
  AssertHelper local_430;
  Message local_428;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<SSL_CTX> server_ctx;
  AssertHelper local_3a0;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_358;
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_310;
  Message local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<SSL_ECH_KEYS> keys12;
  AssertHelper local_2c8;
  Message local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_280;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL_ECH_KEYS> keys1;
  UniquePtr<uint8_t> free_ech_config2;
  AssertHelper local_230;
  Message local_228;
  int local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__3;
  size_t ech_config2_len;
  uint8_t *ech_config2;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__2;
  ScopedEVP_HPKE_KEY key2;
  UniquePtr<uint8_t> free_ech_config1;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  size_t ech_config1_len;
  uint8_t *ech_config1;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key1;
  SSLTest_ECHThreads_Test *this_local;
  
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  peVar2 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  pEVar3 = EVP_hpke_x25519_hkdf_sha256();
  local_94 = EVP_HPKE_KEY_generate(peVar2,pEVar3);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_90,&local_94,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256())"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9a5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  ech_config1._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (ech_config1._4_4_ == 0) {
    peVar2 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar_.message_);
    pcVar4 = (char *)0x10;
    local_104 = SSL_marshal_ech_config
                          ((uint8_t **)&ech_config1_len,(size_t *)&gtest_ar__1.message_,'\x01',
                           peVar2,"public.example",0x10);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_100,&local_104,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&free_ech_config1,(internal *)local_100,
                 (AssertionResult *)
                 "SSL_marshal_ech_config(&ech_config1, &ech_config1_len, 1, key1.get(), \"public.example\", 16)"
                 ,"false","true",pcVar4);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x9aa,pcVar5);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&free_ech_config1);
      testing::Message::~Message(&local_110);
    }
    ech_config1._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (ech_config1._4_4_ == 0) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)(key2.ctx_.public_key + 0x40),
                 (pointer)ech_config1_len);
      internal::
      StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
      ::StackAllocatedMovable
                ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar__2.message_);
      peVar2 = internal::
               StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
               ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                      *)&gtest_ar__2.message_);
      pEVar3 = EVP_hpke_x25519_hkdf_sha256();
      local_1c4 = EVP_HPKE_KEY_generate(peVar2,pEVar3);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_1c0,&local_1c4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&ech_config2,(internal *)local_1c0,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256())","false","true"
                   ,pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x9ad,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        std::__cxx11::string::~string((string *)&ech_config2);
        testing::Message::~Message(&local_1d0);
      }
      ech_config1._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      if (ech_config1._4_4_ == 0) {
        peVar2 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar__2.message_);
        pcVar4 = (char *)0x10;
        local_21c = SSL_marshal_ech_config
                              ((uint8_t **)&ech_config2_len,(size_t *)&gtest_ar__3.message_,'\x02',
                               peVar2,"public.example",0x10);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_218,&local_21c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
        if (!bVar1) {
          testing::Message::Message(&local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&free_ech_config2,(internal *)local_218,
                     (AssertionResult *)
                     "SSL_marshal_ech_config(&ech_config2, &ech_config2_len, 2, key2.get(), \"public.example\", 16)"
                     ,"false","true",pcVar4);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_230,&local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          std::__cxx11::string::~string((string *)&free_ech_config2);
          testing::Message::~Message(&local_228);
        }
        ech_config1._4_4_ = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
        if (ech_config1._4_4_ == 0) {
          std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&keys1,
                     (pointer)ech_config2_len);
          pSVar6 = SSL_ECH_KEYS_new();
          std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     pSVar6);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_270,
                     (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar1) {
            testing::Message::Message(&local_278);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_270,
                       (AssertionResult *)"keys1","false","true",pcVar4);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_280,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9b7,pcVar5);
            testing::internal::AssertHelper::operator=(&local_280,&local_278);
            testing::internal::AssertHelper::~AssertHelper(&local_280);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_278);
          }
          ech_config1._4_4_ = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
          if (ech_config1._4_4_ == 0) {
            psVar7 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            ech_config = ech_config1_len;
            ech_config_len = gtest_ar__1.message_;
            peVar2 = internal::
                     StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                     ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                            *)&gtest_ar_.message_);
            local_2b4 = SSL_ECH_KEYS_add(psVar7,1,(uint8_t *)ech_config,
                                         (size_t)ech_config_len._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl,peVar2);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2b0,&local_2b4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
            if (!bVar1) {
              testing::Message::Message(&local_2c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&keys12,(internal *)local_2b0,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys1.get(), 1, ech_config1, ech_config1_len, key1.get())"
                         ,"false","true",pcVar4);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9b9,pcVar5);
              testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
              testing::internal::AssertHelper::~AssertHelper(&local_2c8);
              std::__cxx11::string::~string((string *)&keys12);
              testing::Message::~Message(&local_2c0);
            }
            ech_config1._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
            if (ech_config1._4_4_ == 0) {
              pSVar6 = SSL_ECH_KEYS_new();
              std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)
                         &gtest_ar__6.message_,pSVar6);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_300,
                         (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                         &gtest_ar__6.message_,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
              if (!bVar1) {
                testing::Message::Message(&local_308);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_300,
                           (AssertionResult *)"keys12","false","true",pcVar4);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_310,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9bb,pcVar5);
                testing::internal::AssertHelper::operator=(&local_310,&local_308);
                testing::internal::AssertHelper::~AssertHelper(&local_310);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_308);
              }
              ech_config1._4_4_ = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
              if (ech_config1._4_4_ == 0) {
                psVar7 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__6.message_);
                peVar2 = internal::
                         StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                         ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                                *)&gtest_ar__2.message_);
                local_344 = SSL_ECH_KEYS_add(psVar7,1,(uint8_t *)ech_config2_len,
                                             (size_t)gtest_ar__3.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,peVar2);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_340,&local_344,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_340);
                if (!bVar1) {
                  testing::Message::Message(&local_350);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_340,
                             (AssertionResult *)
                             "SSL_ECH_KEYS_add(keys12.get(), 1, ech_config2, ech_config2_len, key2.get())"
                             ,"false","true",pcVar4);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_358,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x9bd,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_358,&local_350);
                  testing::internal::AssertHelper::~AssertHelper(&local_358);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_350);
                }
                ech_config1._4_4_ = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
                if (ech_config1._4_4_ == 0) {
                  psVar7 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__6.message_);
                  peVar2 = internal::
                           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                                  *)&gtest_ar_.message_);
                  local_38c = SSL_ECH_KEYS_add(psVar7,0,(uint8_t *)ech_config1_len,
                                               (size_t)gtest_ar__1.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,peVar2);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_388,&local_38c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_388);
                  if (!bVar1) {
                    testing::Message::Message(&local_398);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&server_ctx,(internal *)local_388,
                               (AssertionResult *)
                               "SSL_ECH_KEYS_add(keys12.get(), 0, ech_config1, ech_config1_len, key1.get())"
                               ,"false","true",pcVar4);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x9bf,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
                    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
                    std::__cxx11::string::~string((string *)&server_ctx);
                    testing::Message::~Message(&local_398);
                  }
                  ech_config1._4_4_ = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                  if (ech_config1._4_4_ == 0) {
                    method = TLS_method();
                    CreateContextWithTestCertificate((anon_unknown_0 *)&gtest_ar__9.message_,method)
                    ;
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_3d8,
                               (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3d8);
                    if (!bVar1) {
                      testing::Message::Message(&local_3e0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_3d8,
                                 (AssertionResult *)"server_ctx","false","true",pcVar4);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_3e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x9c3,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                      testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_3e0);
                    }
                    ech_config1._4_4_ = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
                    if (ech_config1._4_4_ == 0) {
                      psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__9.message_);
                      psVar7 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__4.message_);
                      local_41c = SSL_CTX_set1_ech_keys(psVar8,psVar7);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_418,&local_41c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_418);
                      if (!bVar1) {
                        testing::Message::Message(&local_428);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&client_ctx,(internal *)local_418,
                                   (AssertionResult *)
                                   "SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get())","false",
                                   "true",pcVar4);
                        pcVar5 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_430,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x9c4,pcVar5);
                        testing::internal::AssertHelper::operator=(&local_430,&local_428);
                        testing::internal::AssertHelper::~AssertHelper(&local_430);
                        std::__cxx11::string::~string((string *)&client_ctx);
                        testing::Message::~Message(&local_428);
                      }
                      ech_config1._4_4_ = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
                      if (ech_config1._4_4_ == 0) {
                        meth = (SSL_METHOD *)TLS_method();
                        psVar8 = (pointer)SSL_CTX_new(meth);
                        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)
                                   &gtest_ar__11.message_,psVar8);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_468,
                                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__11.message_,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_468);
                        if (!bVar1) {
                          testing::Message::Message(&local_470);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&client,(internal *)local_468,
                                     (AssertionResult *)"client_ctx","false","true",pcVar4);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_478,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x9c7,pcVar5);
                          testing::internal::AssertHelper::operator=(&local_478,&local_470);
                          testing::internal::AssertHelper::~AssertHelper(&local_478);
                          std::__cxx11::string::~string((string *)&client);
                          testing::Message::~Message(&local_470);
                        }
                        ech_config1._4_4_ = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
                        if (ech_config1._4_4_ == 0) {
                          std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
                          std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
                                     &gtest_ar__12.message_);
                          psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__11.message_);
                          server_ctx_00 =
                               std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__9.message_);
                          local_4b9 = CreateClientAndServer
                                                (&server,(UniquePtr<SSL> *)&gtest_ar__12.message_,
                                                 psVar8,server_ctx_00);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_4b8,&local_4b9,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4b8);
                          if (!bVar1) {
                            testing::Message::Message(&local_4c8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_4b8,
                                       (AssertionResult *)
                                       "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                                       ,"false","true",pcVar4);
                            pcVar5 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_4d0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x9ca,pcVar5);
                            testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                            testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_4c8);
                          }
                          ech_config1._4_4_ = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
                          if (ech_config1._4_4_ == 0) {
                            client_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                  (&server);
                            psVar7 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar__4.message_);
                            local_501 = InstallECHConfigList(client_00,psVar7);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_500,&local_501,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_500);
                            if (!bVar1) {
                              testing::Message::Message(&local_510);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)
                                         &threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (internal *)local_500,
                                         (AssertionResult *)
                                         "InstallECHConfigList(client.get(), keys1.get())","false",
                                         "true",pcVar4);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_518,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x9cb,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_518,&local_510);
                              testing::internal::AssertHelper::~AssertHelper(&local_518);
                              std::__cxx11::string::~string
                                        ((string *)
                                         &threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              testing::Message::~Message(&local_510);
                            }
                            ech_config1._4_4_ = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_500)
                            ;
                            if (ech_config1._4_4_ == 0) {
                              std::vector<std::thread,_std::allocator<std::thread>_>::vector
                                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                                         local_550);
                              local_560.client = &server;
                              local_560.server = (UniquePtr<SSL> *)&gtest_ar__12.message_;
                              std::vector<std::thread,std::allocator<std::thread>>::
                              emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__0>
                                        ((vector<std::thread,std::allocator<std::thread>> *)
                                         local_550,&local_560);
                              __range2 = (vector<std::thread,_std::allocator<std::thread>_> *)
                                         &gtest_ar__9.message_;
                              local_568 = &gtest_ar__6.message_;
                              std::vector<std::thread,std::allocator<std::thread>>::
                              emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__1>
                                        ((vector<std::thread,std::allocator<std::thread>> *)
                                         local_550,(type *)&__range2);
                              __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                                                 ((vector<std::thread,_std::allocator<std::thread>_>
                                                   *)local_550);
                              thread = (thread *)
                                       std::vector<std::thread,_std::allocator<std::thread>_>::end
                                                 ((vector<std::thread,_std::allocator<std::thread>_>
                                                   *)local_550);
                              while (bVar1 = __gnu_cxx::operator!=
                                                       (&__end2,(
                                                  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                                  *)&thread), bVar1) {
                                __gnu_cxx::
                                __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                ::operator*(&__end2);
                                std::thread::join();
                                __gnu_cxx::
                                __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                ::operator++(&__end2);
                              }
                              std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                                         local_550);
                              ech_config1._4_4_ = 0;
                            }
                          }
                          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__12.message_);
                          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
                        }
                        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__11.message_);
                      }
                    }
                    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_);
                  }
                }
              }
              std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                         &gtest_ar__6.message_);
            }
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&keys1);
        }
      }
      internal::
      StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
      ::~StackAllocatedMovable
                ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar__2.message_);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)(key2.ctx_.public_key + 0x40)
                );
    }
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHThreads) {
  // Generate a pair of ECHConfigs.
  bssl::ScopedEVP_HPKE_KEY key1;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config1;
  size_t ech_config1_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config1, &ech_config1_len,
                                     /*config_id=*/1, key1.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config1(ech_config1);
  bssl::ScopedEVP_HPKE_KEY key2;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config2;
  size_t ech_config2_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config2, &ech_config2_len,
                                     /*config_id=*/2, key2.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config2(ech_config2);

  // |keys1| contains the first config. |keys12| contains both.
  bssl::UniquePtr<SSL_ECH_KEYS> keys1(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys1);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys1.get(), /*is_retry_config=*/1, ech_config1,
                               ech_config1_len, key1.get()));
  bssl::UniquePtr<SSL_ECH_KEYS> keys12(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys12);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/1, ech_config2,
                               ech_config2_len, key2.get()));
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/0, ech_config1,
                               ech_config1_len, key1.get()));

  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys1.get()));

  // In parallel, complete the connection and reconfigure the ECHConfig. Note
  // |keys12| supports all the keys in |keys1|, so the handshake should complete
  // the same whichever the server uses.
  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));
    EXPECT_TRUE(SSL_ech_accepted(client.get()));
    EXPECT_TRUE(SSL_ech_accepted(server.get()));
  });
  threads.emplace_back([&] {
    EXPECT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys12.get()));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}